

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O2

void __thiscall OpenMD::P2R::writeP2R(P2R *this)

{
  char cVar1;
  ostream *poVar2;
  Revision rev;
  string local_230;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out)
  ;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"P2R: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&ofs,"# ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_230,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&local_230);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_230);
    poVar2 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_230,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&local_230);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_230);
    poVar2 = std::operator<<((ostream *)&ofs,"#nFrames:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->nProcessed_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&ofs,"#selection1: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript1_);
    std::operator<<(poVar2,")");
    if (this->doVect_ == false) {
      poVar2 = std::operator<<((ostream *)&ofs,"\tselection2: (");
      poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript2_);
      std::operator<<(poVar2,")");
    }
    std::operator<<((ostream *)&ofs,"\n");
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).paramString_);
      std::operator<<(poVar2,"\n");
    }
    std::operator<<((ostream *)&ofs,"#P2 correlation:\n");
    poVar2 = std::ostream::_M_insert<double>(this->P2_);
    std::operator<<(poVar2,"\n");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void P2R::writeP2R() {
    std::ofstream ofs(outputFilename_.c_str());
    if (ofs.is_open()) {
      Revision rev;

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << rev.getFullRevision() << "\n";
      ofs << "# " << rev.getBuildDate() << "\n";
      ofs << "#nFrames:\t" << nProcessed_ << "\n";
      ofs << "#selection1: (" << selectionScript1_ << ")";
      if (!doVect_) { ofs << "\tselection2: (" << selectionScript2_ << ")"; }
      ofs << "\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#P2 correlation:\n";
      ofs << P2_ << "\n";

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "P2R: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }